

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O3

void wasm::LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
     ::doVisitLocalGet(RelevantLiveLocalsWalker *self,Expression **currp)

{
  LocalGet *curr;
  BasicBlock *pBVar1;
  Block *pBVar2;
  optional<wasm::Type> type;
  initializer_list<wasm::Expression_*> local_48;
  Expression *local_38;
  Expression **local_30;
  Expression **currp_local;
  Builder builder;
  
  curr = (LocalGet *)*currp;
  local_30 = currp;
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id == LocalGetId)
  {
    pBVar1 = (self->
             super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
             ).
             super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
             .currBasicBlock;
    if (pBVar1 == (BasicBlock *)0x0) {
      currp_local = (Expression **)
                    (self->
                    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    ).
                    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                    .
                    super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    .
                    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    .currModule;
      pBVar2 = (Block *)Builder::replaceWithIdenticalType<wasm::LocalGet>
                                  ((Builder *)&currp_local,curr);
      if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
          LocalGetId) {
        local_38 = (Expression *)MixedArena::allocSpace((MixedArena *)(currp_local + 0x40),0x10,8);
        local_38->_id = UnreachableId;
        (local_38->type).id = 1;
        local_48._M_array = &local_38;
        local_48._M_len = 1;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)
             (curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id;
        pBVar2 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                           ((Builder *)&currp_local,&local_48,type);
      }
      *currp = (Expression *)pBVar2;
    }
    else {
      local_48._M_array = (iterator)((ulong)local_48._M_array & 0xffffffff00000000);
      std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
      emplace_back<wasm::LivenessAction::What,unsigned_int&,wasm::Expression**&>
                ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
                 &(pBVar1->contents).actions,(What *)&local_48,&curr->index,&local_30);
    }
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::LocalGet]");
}

Assistant:

static void doVisitLocalGet(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<LocalGet>();
    // if in unreachable code, ignore
    if (!self->currBasicBlock) {
      Builder builder(*self->getModule());
      auto* rep = builder.replaceWithIdenticalType(curr);
      if (rep->is<LocalGet>()) {
        // We failed to replace the node with something simpler. This can happen
        // if the local is non-nullable, for example. We still need to remove
        // this node entirely, however, as it is unreachable and so we will not
        // see it in the analysis we perform (for example, we may be changing
        // local indexes). Replace it with something completely different, even
        // if it is larger, a block with a forced type that has unreachable
        // contents,
        //
        //  (block (result X)
        //   (unreachable))
        //
        // That pattern lets us set any type we wish.
        //
        // TODO: Make a helper function for this, if it is useful in other
        //       places.
        rep = builder.makeBlock({builder.makeUnreachable()}, curr->type);
      }
      *currp = rep;
      return;
    }
    self->currBasicBlock->contents.actions.emplace_back(
      LivenessAction::Get, curr->index, currp);
  }